

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_calc_mb_wiener_var_mt
               (AV1_COMP *cpi,int num_workers,double *sum_rec_distortion,double *sum_est_rate)

{
  long lVar1;
  AV1_COMP *in_RCX;
  undefined4 in_ESI;
  long *in_RDI;
  int mi_rows;
  AV1EncRowMultiThreadSync *intra_row_mt_sync;
  MultiThreadInfo *mt_info;
  AV1_COMMON *cm;
  int in_stack_00000184;
  AV1_COMMON *in_stack_00000188;
  MultiThreadInfo *in_stack_00000190;
  AV1_COMMON *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  MultiThreadInfo *mt_info_00;
  AVxWorkerHook hook;
  int num_workers_00;
  
  hook = (AVxWorkerHook)(in_RDI + 0x77f0);
  mt_info_00 = (MultiThreadInfo *)(in_RDI + 0x135c9);
  lVar1 = *in_RDI + 0x14e08;
  iVar2 = *(int *)((long)in_RDI + 0x3c194);
  row_mt_sync_mem_alloc
            ((AV1EncRowMultiThreadSync *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8,0);
  *(undefined4 *)(lVar1 + 0x1c) = 0;
  *(undefined4 *)(lVar1 + 0x28) = in_ESI;
  *(undefined4 *)(lVar1 + 0x24) = 0;
  memset(*(void **)(lVar1 + 0x10),0xff,(long)iVar2 << 2);
  iVar2 = (int)((ulong)lVar1 >> 0x20);
  (mt_info_00->enc_row_mt).mb_wiener_mt_exit = false;
  prepare_wiener_var_workers(in_RCX,hook,(int)((ulong)mt_info_00 >> 0x20));
  num_workers_00 = (int)((ulong)hook >> 0x20);
  launch_workers(mt_info_00,iVar2);
  sync_enc_workers(in_stack_00000190,in_stack_00000188,in_stack_00000184);
  dealloc_mb_wiener_var_mt_data(in_RCX,num_workers_00);
  return;
}

Assistant:

void av1_calc_mb_wiener_var_mt(AV1_COMP *cpi, int num_workers,
                               double *sum_rec_distortion,
                               double *sum_est_rate) {
  (void)sum_rec_distortion;
  (void)sum_est_rate;
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadSync *const intra_row_mt_sync =
      &cpi->ppi->intra_row_mt_sync;

  // TODO(chengchen): the memory usage could be improved.
  const int mi_rows = cm->mi_params.mi_rows;
  row_mt_sync_mem_alloc(intra_row_mt_sync, cm, mi_rows);

  intra_row_mt_sync->intrabc_extra_top_right_sb_delay = 0;
  intra_row_mt_sync->num_threads_working = num_workers;
  intra_row_mt_sync->next_mi_row = 0;
  memset(intra_row_mt_sync->num_finished_cols, -1,
         sizeof(*intra_row_mt_sync->num_finished_cols) * mi_rows);
  mt_info->enc_row_mt.mb_wiener_mt_exit = false;

  prepare_wiener_var_workers(cpi, cal_mb_wiener_var_hook, num_workers);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, cm, num_workers);
  dealloc_mb_wiener_var_mt_data(cpi, num_workers);
}